

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O2

void volkInitializeCustom(PFN_vkGetInstanceProcAddr handler)

{
  _func_PFN_vkVoidFunction_void_ptr_char_ptr *in_RSI;
  
  vkGetInstanceProcAddr = handler;
  volkGenLoadLoader(handler,in_RSI);
  return;
}

Assistant:

void volkInitializeCustom(PFN_vkGetInstanceProcAddr handler)
{
	vkGetInstanceProcAddr = handler;

	volkGenLoadLoader(NULL, vkGetInstanceProcAddrStub);
}